

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

string_type * __thiscall
booster::locale::impl_icu::date_format<char>::do_format_abi_cxx11_
          (date_format<char> *this,double value,size_t *codepoints)

{
  int iVar1;
  long *in_RDX;
  long in_RSI;
  string_type *in_RDI;
  double in_XMM0_Qa;
  UnicodeString tmp;
  UDate date;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  UnicodeString *in_stack_ffffffffffffff90;
  icu_std_converter<char,_1> *in_stack_ffffffffffffff98;
  
  icu_70::UnicodeString::UnicodeString
            ((UnicodeString *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  icu_70::DateFormat::format(in_XMM0_Qa * 1000.0,*(UnicodeString **)(in_RSI + 0x40));
  iVar1 = icu_70::UnicodeString::countChar32((int)&stack0xffffffffffffff98,0);
  *in_RDX = (long)iVar1;
  icu_std_converter<char,1>::std_abi_cxx11_(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  icu_70::UnicodeString::~UnicodeString((UnicodeString *)&stack0xffffffffffffff98);
  return in_RDI;
}

Assistant:

string_type do_format(double value,size_t &codepoints) const 
            {
                UDate date = value * 1000.0; /// UDate is time_t in miliseconds
                icu::UnicodeString tmp;
                icu_fmt_->format(date,tmp);
                codepoints=tmp.countChar32();
                return cvt_.std(tmp);
            }